

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AlterRenameColumn(Parse *pParse,SrcList *pSrc,Token *pOld,Token *pNew)

{
  byte bVar1;
  sqlite3 *db;
  Schema *pSVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Table *pTab;
  Parse *pPVar6;
  char *p;
  Schema **ppSVar7;
  Column *pCVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  
  db = pParse->db;
  pTab = sqlite3LocateTableItem(pParse,0,pSrc->a);
  if ((pTab != (Table *)0x0) && (iVar3 = isAlterableTable(pParse,pTab), iVar3 == 0)) {
    if (pTab->nModuleArg == 0 && pTab->pSelect == (Select *)0x0) {
      if (pTab->pSchema == (Schema *)0x0) {
        iVar3 = -1000000;
      }
      else {
        iVar3 = -1;
        ppSVar7 = &db->aDb->pSchema;
        do {
          iVar3 = iVar3 + 1;
          pSVar2 = *ppSVar7;
          ppSVar7 = ppSVar7 + 4;
        } while (pSVar2 != pTab->pSchema);
      }
      pcVar10 = db->aDb[iVar3].zDbSName;
      p = (char *)0x0;
      iVar4 = sqlite3AuthCheck(pParse,0x1a,pcVar10,pTab->zName,(char *)0x0);
      pcVar9 = (char *)0x0;
      if (iVar4 != 0) goto LAB_0017e543;
      pcVar9 = sqlite3NameFromToken(db,pOld);
      uVar11 = 0;
      if (pcVar9 != (char *)0x0) {
        uVar5 = (uint)pTab->nCol;
        if (0 < pTab->nCol) {
          pCVar8 = pTab->aCol;
          uVar11 = 0;
          do {
            iVar4 = sqlite3StrICmp(pCVar8->zName,pcVar9);
            if (iVar4 == 0) goto LAB_0017e63b;
            uVar11 = uVar11 + 1;
            pCVar8 = pCVar8 + 1;
          } while (uVar5 != uVar11);
          uVar11 = (ulong)uVar5;
        }
LAB_0017e63b:
        if ((uint)uVar11 == uVar5) {
          p = (char *)0x0;
          sqlite3ErrorMsg(pParse,"no such column: \"%s\"",pcVar9);
        }
        else {
          pPVar6 = pParse->pToplevel;
          if (pParse->pToplevel == (Parse *)0x0) {
            pPVar6 = pParse;
          }
          pPVar6->mayAbort = '\x01';
          p = sqlite3NameFromToken(db,pNew);
          if (p == (char *)0x0) {
            p = (char *)0x0;
          }
          else {
            bVar1 = ""[(byte)*pNew->z];
            sqlite3NestedParse(pParse,
                               "UPDATE \"%w\".%s SET sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, %d) WHERE name NOT LIKE \'sqlite_%%\' AND (type != \'index\' OR tbl_name = %Q) AND sql NOT LIKE \'create virtual%%\'"
                               ,pcVar10,"sqlite_master",pcVar10,pTab->zName,uVar11,p,
                               (ulong)(bVar1 & 0xffffff80),(ulong)(iVar3 == 1),pTab->zName);
            sqlite3NestedParse(pParse,
                               "UPDATE temp.%s SET sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, 1) WHERE type IN (\'trigger\', \'view\')"
                               ,"sqlite_master",pcVar10,pTab->zName,uVar11 & 0xffffffff,p,
                               (ulong)(bVar1 & 0xffffff80));
            renameReloadSchema(pParse,iVar3);
            renameTestSchema(pParse,pcVar10,(uint)(iVar3 == 1));
          }
        }
        goto LAB_0017e543;
      }
    }
    else {
      pcVar10 = "view";
      if (pTab->pSelect == (Select *)0x0) {
        pcVar10 = (char *)0x0;
      }
      pcVar9 = "virtual table";
      if (pTab->nModuleArg == 0) {
        pcVar9 = pcVar10;
      }
      sqlite3ErrorMsg(pParse,"cannot rename columns of %s \"%s\"",pcVar9,pTab->zName);
    }
  }
  p = (char *)0x0;
  pcVar9 = (char *)0x0;
LAB_0017e543:
  sqlite3SrcListDelete(db,pSrc);
  if (pcVar9 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar9);
  }
  if (p == (char *)0x0) {
    return;
  }
  sqlite3DbFreeNN(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameColumn(
  Parse *pParse,                  /* Parsing context */
  SrcList *pSrc,                  /* Table being altered.  pSrc->nSrc==1 */
  Token *pOld,                    /* Name of column being changed */
  Token *pNew                     /* New column name */
){
  sqlite3 *db = pParse->db;       /* Database connection */
  Table *pTab;                    /* Table being updated */
  int iCol;                       /* Index of column being renamed */
  char *zOld = 0;                 /* Old column name */
  char *zNew = 0;                 /* New column name */
  const char *zDb;                /* Name of schema containing the table */
  int iSchema;                    /* Index of the schema */
  int bQuote;                     /* True to quote the new name */

  /* Locate the table to be altered */
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_column;

  /* Cannot alter a system table */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ) goto exit_rename_column;
  if( SQLITE_OK!=isRealTable(pParse, pTab) ) goto exit_rename_column;

  /* Which schema holds the table to be altered */  
  iSchema = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iSchema>=0 );
  zDb = db->aDb[iSchema].zDbSName;

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_column;
  }
#endif

  /* Make sure the old name really is a column name in the table to be
  ** altered.  Set iCol to be the index of the column being renamed */
  zOld = sqlite3NameFromToken(db, pOld);
  if( !zOld ) goto exit_rename_column;
  for(iCol=0; iCol<pTab->nCol; iCol++){
    if( 0==sqlite3StrICmp(pTab->aCol[iCol].zName, zOld) ) break;
  }
  if( iCol==pTab->nCol ){
    sqlite3ErrorMsg(pParse, "no such column: \"%s\"", zOld);
    goto exit_rename_column;
  }

  /* Do the rename operation using a recursive UPDATE statement that
  ** uses the sqlite_rename_column() SQL function to compute the new
  ** CREATE statement text for the sqlite_master table.
  */
  sqlite3MayAbort(pParse);
  zNew = sqlite3NameFromToken(db, pNew);
  if( !zNew ) goto exit_rename_column;
  assert( pNew->n>0 );
  bQuote = sqlite3Isquote(pNew->z[0]);
  sqlite3NestedParse(pParse, 
      "UPDATE \"%w\".%s SET "
      "sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, %d) "
      "WHERE name NOT LIKE 'sqlite_%%' AND (type != 'index' OR tbl_name = %Q)"
      " AND sql NOT LIKE 'create virtual%%'",
      zDb, MASTER_NAME, 
      zDb, pTab->zName, iCol, zNew, bQuote, iSchema==1,
      pTab->zName
  );

  sqlite3NestedParse(pParse, 
      "UPDATE temp.%s SET "
      "sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, 1) "
      "WHERE type IN ('trigger', 'view')",
      MASTER_NAME, 
      zDb, pTab->zName, iCol, zNew, bQuote
  );

  /* Drop and reload the database schema. */
  renameReloadSchema(pParse, iSchema);
  renameTestSchema(pParse, zDb, iSchema==1);

 exit_rename_column:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zOld);
  sqlite3DbFree(db, zNew);
  return;
}